

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void rearrange_pix(RK_U8 *tmp_line,RK_U8 *base,RK_U32 n)

{
  ushort *puVar1;
  ushort *puVar2;
  RK_U16 *base_u16;
  RK_U16 *pix;
  RK_U32 n_local;
  RK_U8 *base_local;
  RK_U8 *tmp_line_local;
  
  puVar1 = (ushort *)(tmp_line + (n << 4));
  puVar2 = (ushort *)(base + n * 10);
  *puVar1 = *puVar2 & 0x3ff;
  puVar1[1] = (ushort)((int)(*puVar2 & 0xfc00) >> 10) | (puVar2[1] & 0xf) << 6;
  puVar1[2] = (ushort)((int)(puVar2[1] & 0x3ff0) >> 4);
  puVar1[3] = (ushort)((int)(puVar2[1] & 0xc000) >> 0xe) | (puVar2[2] & 0xff) << 2;
  puVar1[4] = puVar2[2] >> 8 | (puVar2[3] & 3) << 8;
  puVar1[5] = (ushort)((int)(puVar2[3] & 0xffc) >> 2);
  puVar1[6] = (ushort)((int)(puVar2[3] & 0xf000) >> 0xc) | (puVar2[4] & 0x3f) << 4;
  puVar1[7] = (ushort)((int)(puVar2[4] & 0xffc0) >> 6);
  return;
}

Assistant:

static void rearrange_pix(RK_U8 *tmp_line, RK_U8 *base, RK_U32 n)
{
    RK_U16 * pix = (RK_U16 *)(tmp_line + n * 16);
    RK_U16 * base_u16 = (RK_U16 *)(base + n * 10);

    pix[0] =  base_u16[0] & 0x03FF;
    pix[1] = (base_u16[0] & 0xFC00) >> 10 | (base_u16[1] & 0x000F) << 6;
    pix[2] = (base_u16[1] & 0x3FF0) >> 4;
    pix[3] = (base_u16[1] & 0xC000) >> 14 | (base_u16[2] & 0x00FF) << 2;
    pix[4] = (base_u16[2] & 0xFF00) >> 8  | (base_u16[3] & 0x0003) << 8;
    pix[5] = (base_u16[3] & 0x0FFC) >> 2;
    pix[6] = (base_u16[3] & 0xF000) >> 12 | (base_u16[4] & 0x003F) << 4;
    pix[7] = (base_u16[4] & 0xFFC0) >> 6;
}